

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
Fiber<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1521:7)>
::destroy(Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1521:7)>
          *this)

{
  PromiseArenaMember *node;
  
  FiberBase::cancel(&this->super_FiberBase);
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  node = &((this->func).promise.super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->func).promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  FiberBase::~FiberBase(&this->super_FiberBase);
  return;
}

Assistant:

~Fiber() noexcept(false) { cancel(); }